

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void kj::ctor<kj::_::ImmediatePromiseNode<kj::OwnFd>,kj::OwnFd>
               (ImmediatePromiseNode<kj::OwnFd> *location,OwnFd *params)

{
  ImmediatePromiseNode<kj::OwnFd> *this;
  OwnFd *value;
  ExceptionOr<kj::OwnFd> local_1c0;
  undefined1 local_1a;
  NoInfer<kj::OwnFd> *local_18;
  OwnFd *params_local;
  ImmediatePromiseNode<kj::OwnFd> *location_local;
  
  local_18 = params;
  params_local = (OwnFd *)location;
  this = (ImmediatePromiseNode<kj::OwnFd> *)operator_new(0x1b0);
  if (this != (ImmediatePromiseNode<kj::OwnFd> *)0x0) {
    local_1a = 1;
    value = fwd<kj::OwnFd>(local_18);
    _::ExceptionOr<kj::OwnFd>::ExceptionOr(&local_1c0,value);
    _::ImmediatePromiseNode<kj::OwnFd>::ImmediatePromiseNode(this,&local_1c0);
  }
  local_1a = 0;
  if (this != (ImmediatePromiseNode<kj::OwnFd> *)0x0) {
    _::ExceptionOr<kj::OwnFd>::~ExceptionOr(&local_1c0);
  }
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}